

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  LocVar *pLVar1;
  ulong uVar2;
  Upvaldesc *pUVar3;
  uint uVar4;
  uint uVar5;
  BlockCnt *pBVar6;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    var->k = VVOID;
    (var->u).info = 0;
    return;
  }
  uVar5 = (uint)fs->nactvar;
  while (uVar4 = uVar5, 0 < (int)uVar4) {
    uVar5 = uVar4 - 1;
    pLVar1 = getlocvar(fs,uVar5);
    if (pLVar1->varname == n) {
      var->t = -1;
      var->f = -1;
      var->k = VLOCAL;
      (var->u).info = uVar5;
      if (base != 0) {
        return;
      }
      pBVar6 = (BlockCnt *)&fs->bl;
      do {
        pBVar6 = pBVar6->previous;
      } while ((int)uVar4 <= (int)(uint)pBVar6->nactvar);
      pBVar6->upval = '\x01';
      return;
    }
  }
  pUVar3 = fs->f->upvalues;
  for (uVar2 = 0; fs->nups != uVar2; uVar2 = uVar2 + 1) {
    if (pUVar3->name == n) goto LAB_0010e952;
    pUVar3 = pUVar3 + 1;
  }
  singlevaraux(fs->prev,n,var,0);
  if (var->k != VVOID) {
    uVar5 = newupvalue(fs,n,var);
    uVar2 = (ulong)uVar5;
LAB_0010e952:
    var->t = -1;
    var->f = -1;
    var->k = VUPVAL;
    (var->u).info = (int)uVar2;
  }
  return;
}

Assistant:

static void singlevaraux(FuncState *fs, TString *n, expdesc *var, int base) {
    if (fs == NULL)  /* no more levels? */
        init_exp(var, VVOID, 0);  /* default is global */
    else {
        int v = searchvar(fs, n);  /* look up locals at current level */
        if (v >= 0) {  /* found? */
            init_exp(var, VLOCAL, v);  /* variable is local */
            if (!base)
                markupval(fs, v);  /* local will be used as an upval */
        } else {  /* not found as local at current level; try upvalues */
            int idx = searchupvalue(fs, n);  /* try existing upvalues */
            if (idx < 0) {  /* not found? */
                singlevaraux(fs->prev, n, var, 0);  /* try upper levels */
                if (var->k == VVOID)  /* not found? */
                    return;  /* it is a global */
                /* else was LOCAL or UPVAL */
                idx = newupvalue(fs, n, var);  /* will be a new upvalue */
            }
            init_exp(var, VUPVAL, idx);  /* new or old upvalue */
        }
    }
}